

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::satisfied(Solver *this,Clause *c)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  lbool local_29;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    uVar4 = (ulong)((uint)c->header >> 5);
    if (uVar4 <= uVar3) break;
    local_29 = value(this,(Lit)c[uVar3 + 1].header);
    bVar2 = lbool::operator==(&local_29,l_True);
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  return uVar3 < uVar4;
}

Assistant:

bool Solver::satisfied(const Clause& c) const {
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True)
            return true;
    return false; }